

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O1

Vector<double,_2> __thiscall mathtool::Vector<double,_2>::normalize(Vector<double,_2> *this)

{
  double dVar1;
  int i;
  long lVar2;
  ostream *poVar3;
  long in_RSI;
  ulong uVar4;
  double sumsqr;
  double dVar5;
  double dVar6;
  double dVar7;
  Vector<double,_2> VVar8;
  
  this->v[0] = 0.0;
  this->v[1] = 0.0;
  dVar5 = 0.0;
  lVar2 = 0;
  do {
    dVar6 = *(double *)(in_RSI + lVar2 * 8);
    dVar5 = dVar5 + dVar6 * dVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  uVar4 = 0;
  dVar6 = -0.0;
  while( true ) {
    dVar1 = *(double *)(in_RSI + uVar4 * 8);
    dVar7 = -dVar1;
    if (-dVar1 <= dVar1) {
      dVar7 = dVar1;
    }
    this->v[uVar4] = dVar1 / dVar5;
    if (dVar5 * 10000000000.0 < dVar7) break;
    uVar4 = uVar4 + 1;
    if (uVar4 != 1) {
      uVar4 = 2;
LAB_00108818:
      if ((uint)uVar4 < 2) {
        uVar4 = uVar4 & 0xffffffff;
        do {
          dVar6 = *(double *)(in_RSI + uVar4 * 8) / dVar5;
          this->v[uVar4] = dVar6;
          uVar4 = uVar4 + 1;
        } while (uVar4 == 1);
      }
      VVar8.v[1] = dVar6;
      VVar8.v[0] = dVar5;
      return (Vector<double,_2>)VVar8.v;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"! taking the norm of a zero",0x1b);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," vector",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  goto LAB_00108818;
}

Assistant:

Vector<T,D> Vector<T,D>::normalize() const     // normalize
    {
        Vector<T,D> newv;
        T magnitude = norm();
        int i;
        for(i=0; i<D; i++){
            newv.v[i] = v[i] / magnitude;
            if(ABS(v[i]) > magnitude * HUGENUMBER){
                cerr << "! taking the norm of a zero" << D << " vector" << endl;
                break;
            }
        }
        for(; i < D; i++){
            newv.v[i] = v[i] / magnitude;
        }
        return newv;
    }